

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDEdgeSharpness __thiscall
ON_SubDEdge::SubdivideSharpness(ON_SubDEdge *this,ON_SubDVertex *end_vertex,bool bReverse)

{
  ON_SubDEdgeSharpness OVar1;
  ON_SubDEdgeSharpness OVar2;
  bool bReverse_local;
  ON_SubDVertex *end_vertex_local;
  ON_SubDEdge *this_local;
  ON_SubDEdgeSharpness OVar3;
  
  if (end_vertex != (ON_SubDVertex *)0x0) {
    if (end_vertex == this->m_vertex[0]) {
      OVar1 = SubdivideSharpness(this,0,bReverse);
      OVar1.m_edge_sharpness[0] = OVar1.m_edge_sharpness[0];
      OVar1.m_edge_sharpness[1] = OVar1.m_edge_sharpness[1];
      return (ON_SubDEdgeSharpness)OVar1.m_edge_sharpness;
    }
    if (end_vertex == this->m_vertex[1]) {
      OVar1 = SubdivideSharpness(this,1,bReverse);
      OVar3.m_edge_sharpness[0] = OVar1.m_edge_sharpness[0];
      OVar3.m_edge_sharpness[1] = OVar1.m_edge_sharpness[1];
      return (ON_SubDEdgeSharpness)OVar3.m_edge_sharpness;
    }
  }
  OVar2.m_edge_sharpness[0] = 0.0;
  OVar2.m_edge_sharpness[1] = 0.0;
  return (ON_SubDEdgeSharpness)OVar2.m_edge_sharpness;
}

Assistant:

const ON_SubDEdgeSharpness ON_SubDEdge::SubdivideSharpness(
  const class ON_SubDVertex* end_vertex,
  bool bReverse
) const
{
  if (nullptr != end_vertex)
  {
    if (end_vertex == this->m_vertex[0])
      return this->SubdivideSharpness(0U, bReverse);
    if (end_vertex == this->m_vertex[1])
      return this->SubdivideSharpness(1U, bReverse);
  }
  return ON_SubDEdgeSharpness::Smooth;
}